

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Slot_Data::Destroy(Am_Slot_Data *this)

{
  Am_Slot local_18;
  
  if ((this->queued_demons != 0) && (this->context != (Am_Object_Data *)0x0)) {
    local_18.data = this;
    Am_Demon_Queue::Delete(&this->context->demon_queue,&local_18);
  }
  this->context = (Am_Object_Data *)0x0;
  if ((this->field_0x38 & 8) == 0) {
    local_18.data = this;
    am_CList::destroy(&this->dependencies,&local_18,false);
    local_18.data = this;
    am_CList::destroy(&this->constraints,&local_18,true);
    Am_Value::~Am_Value(&this->super_Am_Value);
    operator_delete(this,0x40);
  }
  return;
}

Assistant:

void
Am_Slot_Data::Destroy()
{
#ifdef DEBUG
  Global_Reason_Why_Set = Am_TRACE_SLOT_DESTROY;
  Global_Call_Slot_Trace(this);
#endif
  if (queued_demons && context)
    context->demon_queue.Delete(this);
  context = nullptr;
  if (!(flags & BIT_VALIDATING_NOW)) {
    dependencies.destroy(this, false);
    constraints.destroy(this, true);
    delete this;
  }
}